

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall
ON_RevSurface::GetParameterTolerance
          (ON_RevSurface *this,int dir,double t,double *tminus,double *tplus)

{
  bool bVar1;
  int iVar2;
  double t0;
  double t1;
  bool local_31;
  bool rc;
  double *tplus_local;
  double *tminus_local;
  double t_local;
  int dir_local;
  ON_RevSurface *this_local;
  
  local_31 = false;
  t_local._4_4_ = dir;
  if ((this->m_bTransposed & 1U) != 0) {
    t_local._4_4_ = (uint)(dir == 0);
  }
  if (t_local._4_4_ == 0) {
    bVar1 = ON_Interval::IsIncreasing(&this->m_t);
    if (bVar1) {
      t0 = ON_Interval::operator[](&this->m_t,0);
      t1 = ON_Interval::operator[](&this->m_t,1);
      local_31 = ON_GetParameterTolerance(t0,t1,t,tminus,tplus);
    }
  }
  else if ((t_local._4_4_ == 1) && (this->m_curve != (ON_Curve *)0x0)) {
    iVar2 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2d])
                      (t,this->m_curve,tminus,tplus);
    local_31 = (bool)((byte)iVar2 & 1);
  }
  return local_31;
}

Assistant:

bool ON_RevSurface::GetParameterTolerance( // returns tminus < tplus: parameters tminus <= s <= tplus
         int dir,        // 0 gets first parameter, 1 gets second parameter
         double t,       // t = parameter in domain
         double* tminus, // tminus
         double* tplus   // tplus
         ) const
{
  bool rc = false;
  if ( m_bTransposed )
    dir = dir ? 0 : 1;
  if ( dir == 0 )
  {
    if ( m_t.IsIncreasing() )
      rc = ON_GetParameterTolerance( m_t[0], m_t[1], t, tminus, tplus );
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->GetParameterTolerance( t, tminus, tplus );
  }
  return rc;
}